

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  char cVar1;
  short *psVar2;
  char *__s;
  char *__s1;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  uv_interface_address_t *puVar8;
  char *pcVar9;
  size_t __n;
  long *plVar10;
  long *plVar11;
  undefined4 uVar12;
  in_addr_t iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ifaddrs *addrs;
  int local_54;
  long *local_50;
  int *local_48;
  long *local_40;
  uv_interface_address_t **local_38;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar5 = getifaddrs(&local_50);
  plVar10 = local_50;
  if (iVar5 != 0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  for (; plVar10 != (long *)0x0; plVar10 = (long *)*plVar10) {
    if ((((~*(uint *)(plVar10 + 2) & 0x41) == 0) && ((short *)plVar10[3] != (short *)0x0)) &&
       (*(short *)plVar10[3] != 0x11)) {
      *count = *count + 1;
    }
  }
  if ((long)*count == 0) {
    freeifaddrs();
    return 0;
  }
  puVar8 = (uv_interface_address_t *)uv__calloc((long)*count,0x50);
  *addresses = puVar8;
  if (puVar8 == (uv_interface_address_t *)0x0) {
    freeifaddrs(local_50);
    return -0xc;
  }
  plVar10 = local_50;
  if (local_50 != (long *)0x0) {
    do {
      if ((((~*(uint *)(plVar10 + 2) & 0x41) == 0) && ((short *)plVar10[3] != (short *)0x0)) &&
         (*(short *)plVar10[3] != 0x11)) {
        pcVar9 = uv__strdup((char *)plVar10[1]);
        puVar8->name = pcVar9;
        psVar2 = (short *)plVar10[3];
        if (*psVar2 == 10) {
          uVar12 = *(undefined4 *)psVar2;
          iVar13 = *(in_addr_t *)(psVar2 + 2);
          uVar14 = *(undefined4 *)(psVar2 + 4);
          uVar15 = *(undefined4 *)(psVar2 + 6);
          uVar4 = *(undefined8 *)(psVar2 + 10);
          *(undefined8 *)((long)&puVar8->address + 0xc) = *(undefined8 *)(psVar2 + 6);
          *(undefined8 *)((long)&puVar8->address + 0x14) = uVar4;
        }
        else {
          uVar12 = *(undefined4 *)psVar2;
          iVar13 = *(in_addr_t *)(psVar2 + 2);
          uVar14 = *(undefined4 *)(psVar2 + 4);
          uVar15 = *(undefined4 *)(psVar2 + 6);
        }
        *(undefined4 *)&puVar8->address = uVar12;
        (puVar8->address).address4.sin_addr.s_addr = iVar13;
        *(undefined4 *)((long)&puVar8->address + 8) = uVar14;
        *(undefined4 *)((long)&puVar8->address + 0xc) = uVar15;
        psVar2 = (short *)plVar10[4];
        if (*psVar2 == 10) {
          uVar12 = *(undefined4 *)psVar2;
          iVar13 = *(in_addr_t *)(psVar2 + 2);
          uVar14 = *(undefined4 *)(psVar2 + 4);
          uVar15 = *(undefined4 *)(psVar2 + 6);
          uVar4 = *(undefined8 *)(psVar2 + 10);
          *(undefined8 *)((long)&puVar8->netmask + 0xc) = *(undefined8 *)(psVar2 + 6);
          *(undefined8 *)((long)&puVar8->netmask + 0x14) = uVar4;
        }
        else {
          uVar12 = *(undefined4 *)psVar2;
          iVar13 = *(in_addr_t *)(psVar2 + 2);
          uVar14 = *(undefined4 *)(psVar2 + 4);
          uVar15 = *(undefined4 *)(psVar2 + 6);
        }
        *(undefined4 *)&puVar8->netmask = uVar12;
        (puVar8->netmask).netmask4.sin_addr.s_addr = iVar13;
        *(undefined4 *)((long)&puVar8->netmask + 8) = uVar14;
        *(undefined4 *)((long)&puVar8->netmask + 0xc) = uVar15;
        puVar8->is_internal = *(uint *)(plVar10 + 2) >> 3 & 1;
        puVar8 = puVar8 + 1;
      }
      plVar10 = (long *)*plVar10;
    } while (plVar10 != (long *)0x0);
    if (local_50 != (long *)0x0) {
      local_40 = local_50;
      plVar11 = local_50;
      local_48 = count;
      local_38 = addresses;
      do {
        if ((((~*(uint *)(plVar11 + 2) & 0x41) == 0) && ((short *)plVar11[3] != (short *)0x0)) &&
           ((*(short *)plVar11[3] == 0x11 && (local_54 = *local_48, 0 < local_54)))) {
          pcVar9 = (*local_38)->phys_addr;
          iVar5 = 0;
          do {
            __s = (char *)plVar11[1];
            __n = strlen(__s);
            __s1 = ((uv_interface_address_t *)(pcVar9 + -8))->name;
            iVar6 = strncmp(__s1,__s,__n);
            if ((iVar6 == 0) && ((cVar1 = __s1[__n], cVar1 == ':' || (cVar1 == '\0')))) {
              lVar3 = plVar11[3];
              *(undefined2 *)(pcVar9 + 4) = *(undefined2 *)(lVar3 + 0x10);
              *(undefined4 *)pcVar9 = *(undefined4 *)(lVar3 + 0xc);
              local_54 = *local_48;
            }
            iVar5 = iVar5 + 1;
            pcVar9 = pcVar9 + 0x50;
          } while (iVar5 < local_54);
        }
        plVar11 = (long *)*plVar11;
        plVar10 = local_40;
      } while (plVar11 != (long *)0x0);
      goto LAB_004d712a;
    }
  }
  plVar10 = (long *)0x0;
LAB_004d712a:
  freeifaddrs(plVar10);
  return 0;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
#ifndef HAVE_IFADDRS_H
  *count = 0;
  *addresses = NULL;
  return UV_ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  /* Make sure the memory is initiallized to zero using calloc() */
  *addresses = uv__calloc(*count, sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      size_t namelen = strlen(ent->ifa_name);
      /* Alias interface share the same physical address */
      if (strncmp(address->name, ent->ifa_name, namelen) == 0 &&
          (address->name[namelen] == 0 || address->name[namelen] == ':')) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}